

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.cc
# Opt level: O2

void __thiscall avro::MemoryInputStream::skip(MemoryInputStream *this,size_t len)

{
  size_t sVar1;
  ulong uVar2;
  
  while( true ) {
    if (len == 0) {
      return;
    }
    sVar1 = maxLen(this);
    if (sVar1 == 0) break;
    uVar2 = len + this->curLen_;
    if (uVar2 < sVar1) {
      sVar1 = uVar2;
    }
    len = uVar2 - sVar1;
    this->curLen_ = sVar1;
  }
  return;
}

Assistant:

void skip(size_t len) {
        while (len > 0) {
            if (size_t n = maxLen()) {
                if ((curLen_ + len) < n) {
                    n = curLen_ + len;
                }
                len -= n - curLen_;
                curLen_ = n;
            } else {
                break;
            }
        }
    }